

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive.hpp
# Opt level: O1

result_type __thiscall
pstore::serialize::archive::writer_base<pstore::serialize::archive::details::vector_writer_policy>::
put<int>(writer_base<pstore::serialize::archive::details::vector_writer_policy> *this,int *t)

{
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> __result;
  pointer puVar1;
  pointer puVar2;
  
  if (this->flushed_ != true) {
    __result.container = (this->policy_).bytes_;
    puVar1 = ((__result.container)->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    puVar2 = ((__result.container)->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<unsigned_char_const*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              ((uchar *)t,(uchar *)(t + 1),__result);
    this->bytes_consumed_ = this->bytes_consumed_ + 4;
    return (long)puVar1 - (long)puVar2;
  }
  assert_failed("!flushed_",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/serialize/archive.hpp"
                ,0xa3);
}

Assistant:

auto put (Ty const & t) -> result_type {
                    static_assert (std::is_standard_layout<Ty>::value,
                                   "writer_base can only write standard-layout types!");
                    PSTORE_ASSERT (!flushed_);
                    result_type r = policy_.put (t);
                    bytes_consumed_ += sizeof (t);
                    return r;
                }